

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

int __thiscall Database::createNewSlice(Database *this)

{
  int __fd;
  char *__file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int data_fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  uint32_t new_slice_id;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [32];
  string local_30 [36];
  undefined4 local_c;
  
  local_c = **(undefined4 **)(in_RDI + 0xc078);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff70);
  std::__cxx11::to_string(in_stack_ffffffffffffff7c);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator+(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string(local_70);
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x42,0x1a4);
  if (0 < __fd) {
    ftruncate(__fd,0x2000000);
    *(undefined4 *)(*(long *)(in_RDI + 0xc078) + 4) = local_c;
    *(undefined4 *)(*(long *)(in_RDI + 0xc078) + 8) = 0;
    **(int **)(in_RDI + 0xc078) = **(int **)(in_RDI + 0xc078) + 1;
    std::__cxx11::string::~string(local_30);
    return __fd;
  }
  __assert_fail("data_fd > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x6f,"int Database::createNewSlice()");
}

Assistant:

int Database::createNewSlice() {
    auto new_slice_id = metadata->sliceCount;
    auto filename = file_prefix + "." + std::to_string(new_slice_id) + ".data";
    int data_fd = open(filename.c_str(), O_RDWR|O_CREAT, 0644);
    assert(data_fd > 0);
    ftruncate(data_fd, SLICE_SIZE);
    metadata->currentSliceNumber = new_slice_id;
    metadata->currentOffset = 0;
    metadata->sliceCount++;
    return data_fd;
}